

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O1

Code * __thiscall md::Code::not_to_dx(Code *this,DataRegister *reg,Size size)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uchar *puVar5;
  uchar local_41;
  uchar local_40;
  undefined7 uStack_3f;
  uchar *local_38;
  long local_30;
  
  uVar4 = 0x4640;
  if (size != WORD) {
    uVar4 = (uint)(size == LONG) << 7 | 0x4600;
  }
  iVar2 = (*(reg->super_Register).super_Param._vptr_Param[1])(reg);
  iVar3 = (**(reg->super_Register).super_Param._vptr_Param)(reg);
  iVar3 = uVar4 + iVar2 * 8 + iVar3;
  local_40 = (uchar)((uint)iVar3 >> 8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_40);
  local_40 = (uchar)iVar3;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_40);
  (*(reg->super_Register).super_Param._vptr_Param[2])(&local_40,reg);
  puVar5 = (uchar *)CONCAT71(uStack_3f,local_40);
  if (puVar5 != local_38) {
    do {
      local_41 = *puVar5;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_41);
      puVar5 = puVar5 + 1;
    } while (puVar5 != local_38);
  }
  pvVar1 = (void *)CONCAT71(uStack_3f,local_40);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_30 - (long)pvVar1);
  }
  return this;
}

Assistant:

Code& Code::not_to_dx(const DataRegister& reg, Size size)
{
    uint16_t size_code = 0x0;
    if (size == Size::WORD)
        size_code = 0x1;
    else if (size == Size::LONG)
        size_code = 0x2;

    uint16_t opcode = 0x4600 + (size_code << 6) + reg.getMXn();
    this->add_opcode(opcode);
    this->add_bytes(reg.getAdditionnalData());

    return *this;
}